

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

transformation_t *
opengv::absolute_pose::epnp(AbsoluteAdapterBase *adapter,vector<int,_std::allocator<int>_> *indices)

{
  Indices *in_RDI;
  Indices idx;
  Indices *in_stack_00000350;
  AbsoluteAdapterBase *in_stack_00000358;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  
  Indices::Indices(in_RDI,in_stack_ffffffffffffffb8);
  epnp(in_stack_00000358,in_stack_00000350);
  return (transformation_t *)in_RDI;
}

Assistant:

opengv::transformation_t
opengv::absolute_pose::epnp(
    const AbsoluteAdapterBase & adapter,
    const std::vector<int> & indices )
{
  Indices idx(indices);
  return epnp(adapter,idx);
}